

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

void ApplicativeHelper::getHeadAndArgs(Term *term,TermList *head,Deque<Kernel::TermList> *args)

{
  bool bVar1;
  
  if (*(long *)(args + 0x10) != *(long *)(args + 0x18)) {
    *(undefined8 *)(args + 0x10) = *(undefined8 *)(args + 8);
    *(undefined8 *)(args + 0x18) = *(undefined8 *)(args + 8);
  }
  do {
    bVar1 = Kernel::Term::isApplication(term);
    if (!bVar1) {
      return;
    }
    Lib::Deque<Kernel::TermList>::push_front
              (args,(TermList)
                    term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 3]._content);
    term = (Term *)term->_args[(ulong)(*(uint *)&term->field_0xc & 0xfffffff) - 2]._content;
    head->_content = (uint64_t)term;
  } while (((ulong)term & 3) == 0);
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndArgs(const Term* term, TermList& head, Deque<TermList>& args)
{
  ASS(term->isApplication());

  if(!args.isEmpty()){ args.reset(); }

  while(term->isApplication()){
    args.push_front(*term->nthArgument(3)); 
    head = *term->nthArgument(2);
    if(head.isTerm()){ 
      term = head.term();
    } else {  break; }
  }  
}